

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cc
# Opt level: O1

void __thiscall Image::fillSides(Image *this)

{
  char *pcVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  uint uVar5;
  long lVar6;
  
  if (0 < *(int *)&this->field_0x8) {
    iVar3 = 0;
    do {
      lVar2 = *(long *)&this->field_0x10;
      uVar5 = *(uint *)&this->field_0xc;
      lVar4 = (long)(int)(uVar5 * iVar3);
      if ((0 < (int)uVar5) && (*(char *)(lVar2 + lVar4) == -1)) {
        lVar6 = 1;
        do {
          *(undefined1 *)(lVar2 + lVar4 + -1 + lVar6) = 0;
          uVar5 = *(uint *)&this->field_0xc;
          if ((int)uVar5 <= lVar6) break;
          pcVar1 = (char *)(lVar2 + lVar4 + lVar6);
          lVar6 = lVar6 + 1;
        } while (*pcVar1 == -1);
      }
      if (0 < (int)uVar5) {
        lVar6 = (ulong)uVar5 + 1;
        do {
          if (*(char *)(lVar2 + lVar4 + -2 + lVar6) != -1) break;
          *(undefined1 *)(lVar2 + lVar4 + -2 + lVar6) = 0;
          lVar6 = lVar6 + -1;
        } while (1 < lVar6);
      }
      iVar3 = iVar3 + 1;
    } while (iVar3 < *(int *)&this->field_0x8);
  }
  return;
}

Assistant:

void Image::fillSides() {
  // Fill the contour with black pixels (left side)
  for (auto y = 0; y < m_.rows; y++) {
    uint8_t* data = (uint8_t*) m_.data + y * m_.cols;
    for (auto x = 0; x < m_.cols; x++) {
      if (data[x] == 0xff) {
        data[x] = 0x00;
      } else {
        break;
      }
    }
    for (auto x = m_.cols - 1; x >= 0; x--) {
      if (data[x] == 0xff) {
        data[x] = 0x00;
      } else {
        break;
      }
    }
  }
}